

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_complex<std::complex<double>>
          (App *this,string *name,complex<double> *variable,string *description,bool defaulted,
          string *label)

{
  reference pvVar1;
  Option *this_00;
  string local_298 [32];
  string local_278;
  string local_258;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_238;
  string local_218;
  callback_t fun;
  string simple_name;
  stringstream out;
  string local_1b0 [8];
  ostream local_1a8 [24];
  string local_190 [352];
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&out,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&out,0);
  ::std::__cxx11::string::string((string *)&simple_name,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out);
  _out = variable;
  ::std::__cxx11::string::string(local_1b0,(string *)&simple_name);
  ::std::__cxx11::string::string(local_190,(string *)label);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_complex<std::complex<double>>(std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&fun,(anon_class_72_3_15b80c14 *)&out);
  add_complex<std::complex<double>>(std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &out);
  ::std::__cxx11::string::string((string *)&local_218,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_238,&fun);
  ::std::__cxx11::string::string((string *)&local_258,(string *)description);
  this_00 = add_option(this,&local_218,&local_238,&local_258,defaulted);
  ::std::__cxx11::string::~string((string *)&local_258);
  std::_Function_base::~_Function_base(&local_238.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::string::string((string *)&local_278,(string *)label);
  Option::set_custom_option(this_00,&local_278,2);
  ::std::__cxx11::string::~string((string *)&local_278);
  if (defaulted) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    ::std::operator<<(local_1a8,(complex *)variable);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_assign((string *)&this_00->defaultval_);
    ::std::__cxx11::string::~string(local_298);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  std::_Function_base::~_Function_base(&fun.super__Function_base);
  ::std::__cxx11::string::~string((string *)&simple_name);
  return this_00;
}

Assistant:

Option *add_complex(std::string name,
                        T &variable,
                        std::string description = "",
                        bool defaulted = false,
                        std::string label = "COMPLEX") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&variable, simple_name, label](results_t res) {
            double x, y;
            bool worked = detail::lexical_cast(res[0], x) && detail::lexical_cast(res[1], y);
            if(worked)
                variable = T(x, y);
            return worked;
        };

        CLI::Option *opt = add_option(name, fun, description, defaulted);
        opt->set_custom_option(label, 2);
        if(defaulted) {
            std::stringstream out;
            out << variable;
            opt->set_default_str(out.str());
        }
        return opt;
    }